

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void nh_ws_context_free(ws_context_t *ctx)

{
  nh_stream_free(&ctx->stream);
  free((ctx->frame).payload);
  free(ctx);
  return;
}

Assistant:

void nh_ws_context_free(ws_context_t *ctx) {
    nh_stream_free(&ctx->stream);
    if (ctx->frame.payload != NULL) free(ctx->frame.payload);
    free(ctx);
}